

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O2

void ogt_vox_set_memory_allocator(ogt_vox_alloc_func alloc_func,ogt_vox_free_func free_func)

{
  code *pcVar1;
  code *pcVar2;
  
  if ((free_func != (ogt_vox_free_func)0x0) == (alloc_func != (ogt_vox_alloc_func)0x0)) {
    pcVar2 = _ogt_priv_alloc_default;
    if (alloc_func != (ogt_vox_alloc_func)0x0 && free_func != (ogt_vox_free_func)0x0) {
      pcVar2 = alloc_func;
    }
    pcVar1 = _ogt_priv_free_default;
    if (alloc_func != (ogt_vox_alloc_func)0x0 && free_func != (ogt_vox_free_func)0x0) {
      pcVar1 = free_func;
    }
    g_alloc_func = pcVar2;
    g_free_func = pcVar1;
    return;
  }
  __assert_fail("((alloc_func && free_func) || (!alloc_func && !free_func)) && (\"mixed alloc/free functions\")"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                ,0x29a,"void ogt_vox_set_memory_allocator(ogt_vox_alloc_func, ogt_vox_free_func)");
}

Assistant:

void ogt_vox_set_memory_allocator(ogt_vox_alloc_func alloc_func, ogt_vox_free_func free_func)
    {
        ogt_assert((alloc_func && free_func) ||                             // both alloc/free must be non-NULL -OR-
            (!alloc_func && !free_func), "mixed alloc/free functions");     // both alloc/free must be NULL. No mixing 'n matching.
        if (alloc_func && free_func) {
            g_alloc_func = alloc_func;
            g_free_func = free_func;
        }
        else  {
            // reset to default allocate/free functions.
            g_alloc_func = _ogt_priv_alloc_default;
            g_free_func = _ogt_priv_free_default;
        }
    }